

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O1

SHMPTR SHMLinkPool(SHMPTR first,int block_size,int num_blocks)

{
  SHMPTR *pSVar1;
  long lVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    pSVar1 = (SHMPTR *)
             ((ulong)((uint)first & 0xffffff) + (long)shm_segment_bases[first >> 0x18 & 0xff].m_val)
    ;
    lVar2 = (long)block_size;
    if (0 < num_blocks) {
      do {
        first = first + lVar2;
        *pSVar1 = first;
        pSVar1 = (SHMPTR *)((long)pSVar1 + lVar2);
        num_blocks = num_blocks + -1;
      } while (num_blocks != 0);
    }
    *(undefined8 *)((long)pSVar1 - lVar2) = 0;
    if (PAL_InitializeChakraCoreCalled != false) {
      return first - lVar2;
    }
  }
  abort();
}

Assistant:

static SHMPTR SHMLinkPool(SHMPTR first, int block_size, int num_blocks)
{
    LPBYTE item_ptr;
    SHMPTR *shmptr_ptr;
    SHMPTR next_shmptr;
    int i;

    TRACE("Linking %d blocks of %d bytes, starting at 0x%08x\n",
          num_blocks, block_size, first);

    item_ptr = static_cast<LPBYTE>(
        static_cast<LPBYTE>(shm_segment_bases[SHMPTR_SEGMENT(first)].Load()) +
            (SHMPTR_OFFSET(first)));
    next_shmptr = first/*+block_size*/;

    /* Link blocks together */
    for(i=0; i<num_blocks; i++)
    {
        next_shmptr += block_size;

        /* item_ptr is char * (so we can increment with +=blocksize), we cast
           it to a SHMPTR * and set its content to the next SHMPTR in the list*/
        shmptr_ptr = (SHMPTR *)item_ptr;
        *shmptr_ptr = next_shmptr;

        item_ptr+=block_size;
    }
    /* Last SHMPTR in the list must point to NULL */
    item_ptr-=block_size;
    shmptr_ptr = (SHMPTR *)item_ptr;
    *shmptr_ptr = 0;

    /* Return SHMPTR of last element in the list */
    next_shmptr -= block_size;

    TRACE("New linked pool goes from 0x%08x to 0x%08x\n", first, next_shmptr);
    return next_shmptr;
}